

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O1

word * Gia_SimRsbFunc(Gia_SimRsbMan_t *p,int iObj,Vec_Int_t *vFanins,int fOnSet)

{
  uint uVar1;
  int iVar2;
  word *pwVar3;
  int *piVar4;
  word *pwVar5;
  ulong uVar6;
  word *pwVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  word *pFanins [16];
  long local_b8 [17];
  
  uVar1 = vFanins->nSize;
  iVar10 = 1 << ((char)uVar1 - 6U & 0x1f);
  if ((long)(int)uVar1 < 7) {
    iVar10 = 1;
  }
  pwVar7 = (word *)calloc((long)iVar10,8);
  iVar10 = p->nWords;
  uVar12 = iObj * iVar10;
  if (-1 < (int)uVar12) {
    iVar2 = p->vSimsObj->nSize;
    if ((int)uVar12 < iVar2) {
      pwVar3 = p->vSimsObj->pArray;
      local_b8[0xe] = 0;
      local_b8[0xf] = 0;
      local_b8[0xc] = 0;
      local_b8[0xd] = 0;
      local_b8[10] = 0;
      local_b8[0xb] = 0;
      local_b8[8] = 0;
      local_b8[9] = 0;
      local_b8[6] = 0;
      local_b8[7] = 0;
      local_b8[4] = 0;
      local_b8[5] = 0;
      local_b8[2] = 0;
      local_b8[3] = 0;
      local_b8[0] = 0;
      local_b8[1] = 0;
      if (0x10 < (int)uVar1) {
        __assert_fail("Vec_IntSize(vFanins) <= 16",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                      ,0x1cf,"word *Gia_SimRsbFunc(Gia_SimRsbMan_t *, int, Vec_Int_t *, int)");
      }
      if (0 < (int)uVar1) {
        piVar4 = vFanins->pArray;
        lVar14 = 0;
        do {
          uVar15 = piVar4[lVar14] * iVar10;
          if (((int)uVar15 < 0) || (iVar2 <= (int)uVar15)) goto LAB_007b896c;
          local_b8[lVar14] = (long)(pwVar3 + uVar15);
          lVar14 = lVar14 + 1;
        } while ((int)uVar1 != lVar14);
      }
      if (0 < iVar10) {
        uVar15 = iVar10 * 0x40;
        if (iVar10 * 0x40 < 2) {
          uVar15 = 1;
        }
        pwVar5 = p->pFunc[2];
        uVar16 = 0;
        do {
          uVar6 = uVar16 >> 6;
          if (((pwVar5[uVar6] >> (uVar16 & 0x3f) & 1) != 0) &&
             (uVar8 = (uint)uVar16 & 0x3f,
             (uint)((pwVar3[uVar12 + uVar6] >> uVar8 & 1) != 0) == fOnSet)) {
            if ((int)uVar1 < 1) {
              uVar11 = 0;
            }
            else {
              uVar9 = 0;
              uVar11 = 0;
              do {
                uVar13 = 1 << ((byte)uVar9 & 0x1f);
                if ((*(ulong *)(local_b8[uVar9] + uVar6 * 8) & 1L << (sbyte)uVar8) == 0) {
                  uVar13 = 0;
                }
                uVar11 = uVar11 | uVar13;
                uVar9 = uVar9 + 1;
              } while (uVar1 != uVar9);
            }
            pwVar7[(int)uVar11 >> 6] = pwVar7[(int)uVar11 >> 6] | 1L << ((byte)uVar11 & 0x3f);
          }
          uVar8 = (uint)uVar16 + 1;
          uVar16 = (ulong)uVar8;
        } while (uVar8 != uVar15);
      }
      return pwVar7;
    }
  }
LAB_007b896c:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
}

Assistant:

word * Gia_SimRsbFunc( Gia_SimRsbMan_t * p, int iObj, Vec_Int_t * vFanins, int fOnSet )
{
    int nTruthWords = Abc_Truth6WordNum( Vec_IntSize(vFanins) );
    word * pTruth   = ABC_CALLOC( word, nTruthWords ); 
    word * pFunc    = Vec_WrdEntryP( p->vSimsObj, p->nWords*iObj );
    word * pFanins[16] = {NULL};  int s, b, iMint, i, iFanin;
    assert( Vec_IntSize(vFanins) <= 16 );
    Vec_IntForEachEntry( vFanins, iFanin, i )
        pFanins[i] = Vec_WrdEntryP( p->vSimsObj, p->nWords*iFanin );
    for ( s = 0; s < 64*p->nWords; s++ )
    {
        if ( !Abc_TtGetBit(p->pFunc[2], s) || Abc_TtGetBit(pFunc, s) != fOnSet )
            continue;
        iMint = 0;
        for ( b = 0; b < Vec_IntSize(vFanins); b++ )
            if ( Abc_TtGetBit(pFanins[b], s) )
                iMint |= 1 << b;
        Abc_TtSetBit( pTruth, iMint );
    }
    return pTruth;
}